

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageWhiteNoise(Image *__return_storage_ptr__,int width,int height,float factor)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 uVar5;
  
  uVar3 = height * width;
  pvVar2 = malloc((long)(int)uVar3 * 4);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      iVar1 = GetRandomValue(0,99);
      uVar5 = 0xffffffff;
      if ((int)(factor * 100.0) <= iVar1) {
        uVar5 = 0xff000000;
      }
      *(undefined4 *)((long)pvVar2 + uVar4 * 4) = uVar5;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageWhiteNoise(int width, int height, float factor)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width*height; i++)
    {
        if (GetRandomValue(0, 99) < (int)(factor*100.0f)) pixels[i] = WHITE;
        else pixels[i] = BLACK;
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}